

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  XmlFormatting fmt;
  int iVar1;
  XmlWriter *pXVar2;
  string local_c0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  allocator<char> local_39;
  string local_38;
  TestCaseInfo *local_18;
  TestCaseInfo *testInfo_local;
  XmlReporter *this_local;
  
  local_18 = testInfo;
  testInfo_local = (TestCaseInfo *)this;
  StreamingReporterBase::testCaseStarting(&this->super_StreamingReporterBase,testInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TestCase",&local_39);
  fmt = operator|(Newline,Indent);
  pXVar2 = XmlWriter::startElement(&this->m_xml,&local_38,fmt);
  local_60 = operator____sr("name",4);
  StringRef::StringRef(&local_80,&local_18->name);
  local_70 = trim(local_80);
  pXVar2 = XmlWriter::writeAttribute(pXVar2,local_60,local_70);
  local_90 = operator____sr("tags",4);
  TestCaseInfo::tagsAsString_abi_cxx11_(&local_c0,local_18);
  StringRef::StringRef(&local_a0,&local_c0);
  XmlWriter::writeAttribute(pXVar2,local_90,local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  writeSourceInfo(this,&local_18->lineInfo);
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xb])();
  if (iVar1 == 1) {
    Timer::start(&this->m_testCaseTimer);
  }
  XmlWriter::ensureTagClosed(&this->m_xml);
  return;
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name"_sr, trim( StringRef(testInfo.name) ) )
            .writeAttribute( "tags"_sr, testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }